

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

UfsType __thiscall
Clasp::DefaultUnfoundedCheck::findUfs(DefaultUnfoundedCheck *this,Solver *s,bool checkMin)

{
  pointer pAVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  UfsType UVar5;
  
  updateAssignment(this,s);
  do {
    uVar2 = (this->todo_).qFront;
    if (uVar2 == (this->todo_).vec.ebo_.size) {
      (this->todo_).vec.ebo_.size = 0;
      (this->todo_).qFront = 0;
      if (!checkMin) {
        return ufs_none;
      }
      UVar5 = findNonHcfUfs(this,s);
      return UVar5;
    }
    (this->todo_).qFront = uVar2 + 1;
    uVar2 = (this->todo_).vec.ebo_.buf[uVar2];
    pAVar1 = (this->atoms_).ebo_.buf + uVar2;
    *pAVar1 = (AtomData)((uint)*pAVar1 & 0xdfffffff);
  } while ((((int)(this->atoms_).ebo_.buf[uVar2] < 0) ||
           (uVar3 = (this->graph_->atoms_).ebo_.buf[uVar2].super_Node.lit.rep_,
           (byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar3 & 0xfffffffc)) & 3)
           == (byte)(((uVar3 & 2) == 0) + 1U))) || (bVar4 = findSource(this,uVar2), bVar4));
  return ufs_poly;
}

Assistant:

DefaultUnfoundedCheck::UfsType DefaultUnfoundedCheck::findUfs(Solver& s, bool checkMin) {
	// first: remove all sources that were recently falsified
	updateAssignment(s);
	// second: try to re-establish sources.
	while (!todo_.empty()) {
		NodeId head       = todo_.pop_ret();
		atoms_[head].todo = 0;
		if (!atoms_[head].hasSource() && !s.isFalse(graph_->getAtom(head).lit) && !findSource(head)) {
			return ufs_poly;  // found an unfounded set - contained in unfounded_
		}
		assert(sourceQ_.empty());
	}
	todo_.clear();
	return !checkMin ? ufs_none : findNonHcfUfs(s);
}